

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
NamedGeneratorTargetFinder::operator()(NamedGeneratorTargetFinder *this,cmGeneratorTarget *tgt)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  bool bVar3;
  
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
  __n = psVar2->_M_string_length;
  if (__n == (this->Name)._M_string_length) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,(this->Name)._M_dataplus._M_p,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(cmGeneratorTarget* tgt)
  {
    return tgt->GetName() == this->Name;
  }